

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

bool __thiscall GenCADFile::parse_dimension_units(GenCADFile *this,mpc_ast_t *header_ast)

{
  bool bVar1;
  int iVar2;
  GenCADFile *this_00;
  mpc_ast_t *pmVar3;
  char *in_RDI;
  mpc_ast_t *start_child;
  mpc_ast_t *unit;
  mpc_ast_t *units;
  mpc_ast_t *in_stack_ffffffffffffffd0;
  mpc_ast_t *text;
  
  this_00 = (GenCADFile *)mpc_ast_get_child(in_stack_ffffffffffffffd0,in_RDI);
  in_RDI[0xc0] = '\a';
  in_RDI[0xc1] = '\0';
  in_RDI[0xc2] = '\0';
  in_RDI[0xc3] = '\0';
  if ((this_00 != (GenCADFile *)0x0) &&
     (*(int *)&(this_00->super_BRDFileBase).outline_segments.
               super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
               ._M_impl.super__Vector_impl_data._M_start == 4)) {
    pmVar3 = mpc_ast_get_child(in_stack_ffffffffffffffd0,in_RDI);
    if (pmVar3 != (mpc_ast_t *)0x0) {
      bVar1 = has_text_content(this_00,pmVar3,(char *)in_stack_ffffffffffffffd0);
      if (bVar1) {
        in_RDI[0xc0] = '\0';
        in_RDI[0xc1] = '\0';
        in_RDI[0xc2] = '\0';
        in_RDI[0xc3] = '\0';
      }
      else {
        bVar1 = has_text_content(this_00,pmVar3,(char *)in_stack_ffffffffffffffd0);
        if (bVar1) {
          in_RDI[0xc0] = '\x01';
          in_RDI[0xc1] = '\0';
          in_RDI[0xc2] = '\0';
          in_RDI[0xc3] = '\0';
        }
        else {
          bVar1 = has_text_content(this_00,pmVar3,(char *)in_stack_ffffffffffffffd0);
          if (bVar1) {
            in_RDI[0xc0] = '\x02';
            in_RDI[0xc1] = '\0';
            in_RDI[0xc2] = '\0';
            in_RDI[0xc3] = '\0';
          }
          else {
            bVar1 = has_text_content(this_00,pmVar3,(char *)in_stack_ffffffffffffffd0);
            if (bVar1) {
              in_RDI[0xc0] = '\x03';
              in_RDI[0xc1] = '\0';
              in_RDI[0xc2] = '\0';
              in_RDI[0xc3] = '\0';
            }
          }
        }
      }
      return true;
    }
    pmVar3 = mpc_ast_get_child(in_stack_ffffffffffffffd0,in_RDI);
    if (pmVar3->children_num == 3) {
      text = *pmVar3->children;
      bVar1 = has_text_content(this_00,pmVar3,(char *)text);
      if (bVar1) {
        in_RDI[0xc0] = '\x04';
        in_RDI[0xc1] = '\0';
        in_RDI[0xc2] = '\0';
        in_RDI[0xc3] = '\0';
      }
      else {
        bVar1 = has_text_content(this_00,pmVar3,(char *)text);
        if (bVar1) {
          in_RDI[0xc0] = '\x05';
          in_RDI[0xc1] = '\0';
          in_RDI[0xc2] = '\0';
          in_RDI[0xc3] = '\0';
        }
        else {
          bVar1 = has_text_content(this_00,pmVar3,(char *)text);
          if (bVar1) {
            in_RDI[0xc0] = '\x06';
            in_RDI[0xc1] = '\0';
            in_RDI[0xc2] = '\0';
            in_RDI[0xc3] = '\0';
          }
        }
      }
      if (*(int *)(in_RDI + 0xc0) != 7) {
        iVar2 = atoi(pmVar3->children[2]->contents);
        *(int *)(in_RDI + 0xc4) = iVar2;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GenCADFile::parse_dimension_units(mpc_ast_t *header_ast) {
	mpc_ast_t *units = mpc_ast_get_child(header_ast, "units|>");
	m_dimension      = INVALID;
	if (!units) return false;

	if (units->children_num == 4) {
		// Try UNITS <unit> format
		mpc_ast_t *unit = mpc_ast_get_child(units, "unit|dimension|string");
		if (unit) {
			if (has_text_content(unit, "INCH")) {
				m_dimension = INCH;
			} else if (has_text_content(unit, "THOU")) {
				m_dimension = THOU;
			} else if (has_text_content(unit, "MM")) {
				m_dimension = MM;
			} else if (has_text_content(unit, "MM100")) {
				m_dimension = MM100;
			}
			return true;
		}

		// UNITS <unit> does not match -> try UNITS <unit> <dimension_unit>
		unit = mpc_ast_get_child(units, "unit|dimension|>");
		if (unit->children_num == 3) {
			mpc_ast_t *start_child = unit->children[0];
			if (has_text_content(start_child, "USER")) {
				m_dimension = USER;
			} else if (has_text_content(start_child, "USERM")) {
				m_dimension = USERCM;
			} else if (has_text_content(start_child, "USERMM")) {
				m_dimension = USERMM;
			}

			if (m_dimension != INVALID) {
				m_dimension_unit = atoi(unit->children[2]->contents);
				return true;
			}
		}
	}

	return false;
}